

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int luv_fs_sendfile(lua_State *L)

{
  int *piVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  lua_Integer off;
  size_t len;
  uv_fs_t *req_00;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  uv_fs_cb cb;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  int nargs;
  luv_req_t *data;
  int sync;
  int ret;
  uv_fs_t *req;
  int ref;
  size_t length;
  int64_t in_offset;
  uv_file in_fd;
  uv_file out_fd;
  lua_State *L_local;
  
  lVar3 = luaL_checkinteger(L,1);
  lVar4 = luaL_checkinteger(L,2);
  off = luaL_checkinteger(L,3);
  len = luaL_checkinteger(L,4);
  iVar2 = luv_check_continuation(L,5);
  req_00 = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar2);
  req_00->data = plVar5;
  piVar1 = (int *)req_00->data;
  bVar8 = piVar1[1] == -2;
  loop = luv_loop(L);
  cb = luv_fs_cb;
  if (bVar8) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_sendfile(loop,req_00,(uv_file)lVar3,(uv_file)lVar4,off,len,cb);
  if ((req_00->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (bVar8) {
      L_local._4_4_ = push_fs_result(L,req_00);
      if (req_00->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req_00->data);
        req_00->data = (void *)0x0;
        uv_fs_req_cleanup(req_00);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)*piVar1);
      L_local._4_4_ = 1;
    }
  }
  else {
    lua_pushnil(L);
    if (req_00->path == (char *)0x0) {
      pcVar6 = uv_err_name((int)req_00->result);
      pcVar7 = uv_strerror((int)req_00->result);
      lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
    }
    else {
      pcVar6 = uv_err_name((int)req_00->result);
      pcVar7 = uv_strerror((int)req_00->result);
      lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req_00->path);
    }
    pcVar6 = uv_err_name((int)req_00->result);
    lua_pushstring(L,pcVar6);
    luv_cleanup_req(L,(luv_req_t *)req_00->data);
    req_00->data = (void *)0x0;
    uv_fs_req_cleanup(req_00);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_sendfile(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file out_fd = luaL_checkinteger(L, 1);
  uv_file in_fd = luaL_checkinteger(L, 2);
  int64_t in_offset = luaL_checkinteger(L, 3);
  size_t length = luaL_checkinteger(L, 4);
  int ref = luv_check_continuation(L, 5);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(sendfile, req, out_fd, in_fd, in_offset, length);
}